

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O3

DataPiece *
google::protobuf::util::converter::DefaultValueObjectWriter::CreateDefaultDataPieceForField
          (DataPiece *__return_storage_ptr__,Field *field,TypeInfo *typeinfo,bool use_ints_for_enums
          )

{
  string *psVar1;
  int64 iVar2;
  size_t sVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  pointer pcVar6;
  DataPiece local_80;
  undefined1 local_58 [8];
  StatusOr<long> result;
  
  switch(field->kind_) {
  case 1:
    psVar1 = (field->default_value_).ptr_;
    pcVar6 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
LAB_00309419:
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      local_80.type_ = TYPE_STRING;
      local_80.use_strict_base64_decoding_ = true;
      local_80.field_2.i64_ = (int64)pcVar6;
      local_80.field_2.str_.size_ = sVar3;
      DataPiece::ToDouble((StatusOr<double> *)local_58,&local_80);
      if (local_58._0_4_ == OK) {
        result.value_ =
             CONCAT44(result.status_.error_message_.field_2._12_4_,
                      result.status_.error_message_.field_2._8_4_);
      }
      else {
        result.value_ = 0;
      }
      if ((size_type *)result.status_._0_8_ != &result.status_.error_message_._M_string_length) {
        operator_delete((void *)result.status_._0_8_);
      }
    }
    else {
      if (sVar3 != 0) goto LAB_00309419;
      result.value_ = 0;
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_DOUBLE;
    (__return_storage_ptr__->field_2).i64_ = result.value_;
    goto LAB_0030937b;
  case 2:
    psVar1 = (field->default_value_).ptr_;
    pcVar6 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
LAB_003094a4:
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      local_80.type_ = TYPE_STRING;
      local_80.use_strict_base64_decoding_ = true;
      local_80.field_2.i64_ = (int64)pcVar6;
      local_80.field_2.str_.size_ = sVar3;
      DataPiece::ToFloat((StatusOr<float> *)local_58,&local_80);
      result.value_._0_4_ = result.status_.error_message_.field_2._8_4_;
      if (local_58._0_4_ != OK) {
        result.value_._0_4_ = 0;
      }
      if ((size_type *)result.status_._0_8_ != &result.status_.error_message_._M_string_length) {
        operator_delete((void *)result.status_._0_8_);
      }
    }
    else {
      if (sVar3 != 0) goto LAB_003094a4;
      result.value_._0_4_ = 0;
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_FLOAT;
    (__return_storage_ptr__->field_2).i32_ = result.value_._0_4_;
    goto LAB_0030937b;
  case 3:
  case 0x10:
  case 0x12:
    psVar1 = (field->default_value_).ptr_;
    pcVar6 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
LAB_00309106:
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      local_80.type_ = TYPE_STRING;
      local_80.use_strict_base64_decoding_ = true;
      local_80.field_2.i64_ = (int64)pcVar6;
      local_80.field_2.str_.size_ = sVar3;
      DataPiece::ToInt64((StatusOr<long> *)local_58,&local_80);
      if (local_58._0_4_ == OK) {
        iVar2 = CONCAT44(result.status_.error_message_.field_2._12_4_,
                         result.status_.error_message_.field_2._8_4_);
      }
      else {
        iVar2 = 0;
      }
      if ((size_type *)result.status_._0_8_ != &result.status_.error_message_._M_string_length) {
        operator_delete((void *)result.status_._0_8_);
      }
    }
    else {
      if (sVar3 != 0) goto LAB_00309106;
      iVar2 = 0;
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_INT64;
    break;
  case 4:
  case 6:
    psVar1 = (field->default_value_).ptr_;
    pcVar6 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
LAB_00309310:
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      local_80.type_ = TYPE_STRING;
      local_80.use_strict_base64_decoding_ = true;
      local_80.field_2.i64_ = (int64)pcVar6;
      local_80.field_2.str_.size_ = sVar3;
      DataPiece::ToUint64((StatusOr<unsigned_long> *)local_58,&local_80);
      if (local_58._0_4_ == OK) {
        iVar2 = CONCAT44(result.status_.error_message_.field_2._12_4_,
                         result.status_.error_message_.field_2._8_4_);
      }
      else {
        iVar2 = 0;
      }
      if ((size_type *)result.status_._0_8_ != &result.status_.error_message_._M_string_length) {
        operator_delete((void *)result.status_._0_8_);
      }
    }
    else {
      if (sVar3 != 0) goto LAB_00309310;
      iVar2 = 0;
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_UINT64;
    break;
  case 5:
  case 0xf:
  case 0x11:
    psVar1 = (field->default_value_).ptr_;
    pcVar6 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
LAB_0030908d:
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      local_80.type_ = TYPE_STRING;
      local_80.use_strict_base64_decoding_ = true;
      local_80.field_2.i64_ = (int64)pcVar6;
      local_80.field_2.str_.size_ = sVar3;
      DataPiece::ToInt32((StatusOr<int> *)local_58,&local_80);
      uVar5 = 0;
      if (local_58._0_4_ == OK) {
        uVar5 = result.status_.error_message_.field_2._8_4_;
      }
      if ((size_type *)result.status_._0_8_ != &result.status_.error_message_._M_string_length) {
        operator_delete((void *)result.status_._0_8_);
      }
    }
    else {
      if (sVar3 != 0) goto LAB_0030908d;
      uVar5 = 0;
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_INT32;
    goto LAB_003092fb;
  case 7:
  case 0xd:
    psVar1 = (field->default_value_).ptr_;
    pcVar6 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
LAB_00309296:
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      local_80.type_ = TYPE_STRING;
      local_80.use_strict_base64_decoding_ = true;
      local_80.field_2.i64_ = (int64)pcVar6;
      local_80.field_2.str_.size_ = sVar3;
      DataPiece::ToUint32((StatusOr<unsigned_int> *)local_58,&local_80);
      uVar5 = 0;
      if (local_58._0_4_ == OK) {
        uVar5 = result.status_.error_message_.field_2._8_4_;
      }
      if ((size_type *)result.status_._0_8_ != &result.status_.error_message_._M_string_length) {
        operator_delete((void *)result.status_._0_8_);
      }
    }
    else {
      if (sVar3 != 0) goto LAB_00309296;
      uVar5 = 0;
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_UINT32;
LAB_003092fb:
    (__return_storage_ptr__->field_2).i32_ = uVar5;
    goto LAB_0030937b;
  case 8:
    psVar1 = (field->default_value_).ptr_;
    pcVar6 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
LAB_0030939c:
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      local_80.type_ = TYPE_STRING;
      local_80.use_strict_base64_decoding_ = true;
      local_80.field_2.i64_ = (int64)pcVar6;
      local_80.field_2.str_.size_ = sVar3;
      DataPiece::ToBool((StatusOr<bool> *)local_58,&local_80);
      uVar4 = '\0';
      if (local_58._0_4_ == OK) {
        uVar4 = result.status_.error_message_.field_2._M_local_buf[8];
      }
      if ((size_type *)result.status_._0_8_ != &result.status_.error_message_._M_string_length) {
        operator_delete((void *)result.status_._0_8_);
      }
    }
    else {
      if (sVar3 != 0) goto LAB_0030939c;
      uVar4 = false;
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_BOOL;
    (__return_storage_ptr__->field_2).bool_ = (bool)uVar4;
    goto LAB_0030937b;
  case 9:
    psVar1 = (field->default_value_).ptr_;
    pcVar6 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_STRING;
    goto LAB_00309245;
  default:
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_NULL;
    (__return_storage_ptr__->field_2).i32_ = 0;
    goto LAB_0030937b;
  case 0xc:
    psVar1 = (field->default_value_).ptr_;
    pcVar6 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_BYTES;
LAB_00309245:
    (__return_storage_ptr__->field_2).i64_ = (int64)pcVar6;
    (__return_storage_ptr__->field_2).str_.size_ = sVar3;
    __return_storage_ptr__->use_strict_base64_decoding_ = true;
    return __return_storage_ptr__;
  case 0xe:
    FindEnumDefault(__return_storage_ptr__,field,typeinfo,use_ints_for_enums);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->field_2).i64_ = iVar2;
LAB_0030937b:
  __return_storage_ptr__->use_strict_base64_decoding_ = false;
  return __return_storage_ptr__;
}

Assistant:

DataPiece DefaultValueObjectWriter::CreateDefaultDataPieceForField(
    const google::protobuf::Field& field, const TypeInfo* typeinfo,
    bool use_ints_for_enums) {
  switch (field.kind()) {
    case google::protobuf::Field::TYPE_DOUBLE: {
      return DataPiece(ConvertTo<double>(
          field.default_value(), &DataPiece::ToDouble, static_cast<double>(0)));
    }
    case google::protobuf::Field::TYPE_FLOAT: {
      return DataPiece(ConvertTo<float>(
          field.default_value(), &DataPiece::ToFloat, static_cast<float>(0)));
    }
    case google::protobuf::Field::TYPE_INT64:
    case google::protobuf::Field::TYPE_SINT64:
    case google::protobuf::Field::TYPE_SFIXED64: {
      return DataPiece(ConvertTo<int64>(
          field.default_value(), &DataPiece::ToInt64, static_cast<int64>(0)));
    }
    case google::protobuf::Field::TYPE_UINT64:
    case google::protobuf::Field::TYPE_FIXED64: {
      return DataPiece(ConvertTo<uint64>(
          field.default_value(), &DataPiece::ToUint64, static_cast<uint64>(0)));
    }
    case google::protobuf::Field::TYPE_INT32:
    case google::protobuf::Field::TYPE_SINT32:
    case google::protobuf::Field::TYPE_SFIXED32: {
      return DataPiece(ConvertTo<int32>(
          field.default_value(), &DataPiece::ToInt32, static_cast<int32>(0)));
    }
    case google::protobuf::Field::TYPE_BOOL: {
      return DataPiece(
          ConvertTo<bool>(field.default_value(), &DataPiece::ToBool, false));
    }
    case google::protobuf::Field::TYPE_STRING: {
      return DataPiece(field.default_value(), true);
    }
    case google::protobuf::Field::TYPE_BYTES: {
      return DataPiece(field.default_value(), false, true);
    }
    case google::protobuf::Field::TYPE_UINT32:
    case google::protobuf::Field::TYPE_FIXED32: {
      return DataPiece(ConvertTo<uint32>(
          field.default_value(), &DataPiece::ToUint32, static_cast<uint32>(0)));
    }
    case google::protobuf::Field::TYPE_ENUM: {
      return FindEnumDefault(field, typeinfo, use_ints_for_enums);
    }
    default: {
      return DataPiece::NullData();
    }
  }
}